

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O3

void __thiscall HFactor::buildSimple(HFactor *this)

{
  pointer *ppcVar1;
  double dVar2;
  int iVar3;
  HighsInt *pHVar4;
  iterator iVar5;
  iterator iVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer pdVar12;
  bool bVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  bool bVar15;
  pointer piVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int *piVar21;
  double *pdVar22;
  int8_t *__args;
  iterator iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  size_type sVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int8_t pivot_type;
  HighsInt iMat;
  HighsInt iRow_1;
  HighsInt iRow;
  char local_125;
  int local_124;
  undefined8 local_120;
  int local_114;
  vector<int,std::allocator<int>> *local_110;
  vector<int,std::allocator<int>> *local_108;
  vector<int,std::allocator<int>> *local_100;
  ulong local_f8;
  double local_f0;
  vector<double,_std::allocator<double>_> *local_e8;
  vector<int,std::allocator<int>> *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  ulong local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  long local_b8;
  uint local_ac;
  vector<signed_char,std::allocator<signed_char>> *local_a8;
  vector<int,std::allocator<int>> *local_a0;
  vector<int,std::allocator<int>> *local_98;
  vector<int,_std::allocator<int>_> *local_90;
  vector<double,std::allocator<double>> *local_88;
  vector<int,std::allocator<int>> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  double local_70;
  long local_68;
  ulong local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  luClear(this);
  iVar27 = this->num_basic;
  std::vector<int,_std::allocator<int>_>::resize(&this->permute,(long)iVar27);
  local_120 = (double)CONCAT44(local_120._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->permute,(long)iVar27,(value_type_conflict2 *)&local_120);
  if (0 < (long)this->num_row) {
    memset((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,0,(long)this->num_row << 2);
  }
  iVar27 = 0;
  this->nwork = 0;
  sVar29 = (long)this->num_basic + 1;
  local_120 = (double)((ulong)local_120 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->iwork,sVar29,(value_type_conflict2 *)&local_120);
  local_120 = (double)((ulong)local_120 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iwork,sVar29,(value_type_conflict2 *)&local_120);
  if (0 < this->num_basic) {
    local_d8 = &this->l_start;
    local_e0 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_e8 = &this->u_pivot_value;
    local_100 = (vector<int,std::allocator<int>> *)&this->u_start;
    local_108 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_row;
    local_110 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_var;
    lVar18 = 0;
    iVar27 = 0;
    do {
      local_124 = this->basic_index[lVar18];
      local_114 = -1;
      local_125 = -1;
      if (local_124 < this->num_col) {
        iVar24 = this->a_start[local_124];
        lVar20 = (long)iVar24;
        iVar3 = this->a_start[(long)local_124 + 1];
        if ((((iVar3 - iVar24 != 1) || (this->a_value[lVar20] != 1.0)) ||
            (NAN(this->a_value[lVar20]))) ||
           ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[this->a_index[lVar20]] < 0)) {
          iVar17 = iVar27;
          if (iVar24 < iVar3) {
            piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pHVar4 = this->a_index;
            pdVar22 = this->a_value;
            piVar16 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar12 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar31 = 0;
            do {
              piVar21 = piVar7 + pHVar4[lVar20 + lVar31];
              *piVar21 = *piVar21 + 1;
              piVar16[iVar27 + lVar31] = pHVar4[lVar20 + lVar31];
              pdVar12[iVar27 + lVar31] = pdVar22[lVar20 + lVar31];
              lVar31 = lVar31 + 1;
            } while (iVar3 - lVar20 != lVar31);
            iVar17 = iVar27 + (int)lVar31;
          }
LAB_0036a6e6:
          iVar27 = this->nwork;
          this->nwork = iVar27 + 1;
          (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar27] = (int)lVar18;
          iVar27 = iVar17;
        }
        else {
          local_125 = '\x03';
          local_114 = this->a_index[lVar20];
        }
      }
      else {
        iVar24 = local_124 - this->num_col;
        piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = piVar7[iVar24];
        if (iVar17 < 0) {
          piVar7[iVar24] = iVar17 + 1;
          (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar27] = iVar24;
          iVar17 = iVar27 + 1;
          (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar27] = 1.0;
          goto LAB_0036a6e6;
        }
        local_125 = '\0';
        local_114 = iVar24;
      }
      if (-1 < local_114) {
        (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] = local_114;
        iVar17 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_120 = (double)CONCAT44(local_120._4_4_,iVar17);
        iVar5._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_d8,iVar5,(int *)&local_120);
        }
        else {
          *iVar5._M_current = iVar17;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_e0,iVar5,&local_114);
        }
        else {
          *iVar5._M_current = local_114;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_120 = 1.0;
        iVar6._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_e8,iVar6,(double *)&local_120);
        }
        else {
          *iVar6._M_current = 1.0;
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        iVar17 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_120 = (double)CONCAT44(local_120._4_4_,iVar17);
        iVar5._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_100,iVar5,(int *)&local_120);
        }
        else {
          *iVar5._M_current = iVar17;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_114] = -this->num_basic;
        iVar5._M_current =
             (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_108,iVar5,&local_114);
        }
        else {
          *iVar5._M_current = local_114;
          (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_110,iVar5,&local_124);
        }
        else {
          *iVar5._M_current = local_124;
          (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar23._M_current =
             (this->refactor_info_).pivot_type.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar23._M_current ==
            (this->refactor_info_).pivot_type.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<signed_char,std::allocator<signed_char>>::
          _M_realloc_insert<signed_char_const&>
                    ((vector<signed_char,std::allocator<signed_char>> *)
                     &(this->refactor_info_).pivot_type,iVar23,&local_125);
        }
        else {
          *iVar23._M_current = local_125;
          ppcVar1 = &(this->refactor_info_).pivot_type.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar18 + 1] = iVar27;
      (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar18] = local_124;
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->num_basic);
  }
  uVar28 = this->nwork;
  iVar17 = this->num_row - uVar28;
  this->basis_matrix_num_el = iVar17 + iVar27;
  this->build_synthetic_tick = (double)(iVar17 * 0x50 + iVar27 * 0x3c) + this->build_synthetic_tick;
  local_e0 = (vector<int,std::allocator<int>> *)&this->l_index;
  lVar18 = (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar20 = lVar18 >> 2;
  auVar32._8_4_ = (int)(lVar18 >> 0x22);
  auVar32._0_8_ = lVar20;
  auVar32._12_4_ = 0x45300000;
  dStack_40 = auVar32._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
  local_100 = (vector<int,std::allocator<int>> *)&this->u_index;
  lVar18 = (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar20 = lVar18 >> 2;
  auVar33._8_4_ = (int)(lVar18 >> 0x22);
  auVar33._0_8_ = lVar20;
  auVar33._12_4_ = 0x45300000;
  dStack_50 = auVar33._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
  local_70 = (double)(int)uVar28;
  local_108 = (vector<int,std::allocator<int>> *)&this->u_value;
  local_78 = &this->l_start;
  local_80 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
  local_88 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
  local_90 = &this->u_start;
  local_98 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_row;
  local_a0 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_var;
  local_a8 = (vector<signed_char,std::allocator<signed_char>> *)&(this->refactor_info_).pivot_type;
  local_e8 = &this->l_value;
  local_f0 = 0.0;
LAB_0036aa34:
  uVar19 = uVar28;
  if (0 < (int)uVar28) {
    this->nwork = 0;
    local_60 = (ulong)uVar28;
    uVar30 = 0;
    local_ac = uVar28;
LAB_0036aa59:
    piVar7 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar16 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar27 = piVar7[uVar30];
    local_d0 = (vector<double,_std::allocator<double>_> *)(long)iVar27;
    uVar28 = piVar16[(long)local_d0];
    uVar19 = piVar16[(long)local_d0 + 1];
    local_110 = (vector<int,std::allocator<int>> *)CONCAT44(local_110._4_4_,uVar19);
    local_c0 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_c0._4_4_,uVar19 - uVar28);
    if (uVar19 - uVar28 != 0 && (int)uVar28 <= (int)uVar19) {
      lVar31 = (long)(int)uVar28;
      piVar16 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar20 = lVar31 << 0x20;
      lVar18 = lVar31 * 4;
      piVar21 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar31;
      uVar25 = 0xffffffff;
      iVar17 = 0;
      local_c8 = CONCAT44(local_c8._4_4_,uVar28);
      uVar26 = uVar28;
LAB_0036aac5:
      iVar24 = piVar16[*piVar21];
      local_f8 = uVar30;
      if (iVar24 != 1) goto code_r0x0036aad6;
      local_68 = lVar20 >> 0x20;
      local_d8 = (vector<int,_std::allocator<int>_> *)
                 (1.0 / *(double *)
                         ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start + (lVar20 >> 0x1d)));
      local_b8 = CONCAT44(local_b8._4_4_,uVar26 + 1);
      bVar15 = true;
      do {
        bVar13 = bVar15;
        iVar27 = (int)local_b8;
        if (bVar13) {
          iVar27 = (int)local_c8;
        }
        uVar28 = (uint)local_110;
        if (bVar13) {
          uVar28 = uVar26;
        }
        iVar17 = uVar28 - iVar27;
        if (iVar17 != 0 && iVar27 <= (int)uVar28) {
          lVar20 = (long)iVar27;
          lVar18 = lVar20 * 8;
          do {
            local_124 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar20];
            if (piVar16[local_124] < 1) {
              iVar5._M_current =
                   (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_100,iVar5,&local_124);
              }
              else {
                *iVar5._M_current = local_124;
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              pdVar22 = (double *)
                        ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar18);
              iVar6._M_current =
                   (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)local_108,iVar6,pdVar22);
              }
              else {
                *iVar6._M_current = *pdVar22;
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
            }
            else {
              iVar5._M_current =
                   (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_e0,iVar5,&local_124);
              }
              else {
                *iVar5._M_current = local_124;
                (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              local_120 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar20] * (double)local_d8;
              iVar6._M_current =
                   (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_e8,iVar6,(double *)&local_120);
              }
              else {
                *iVar6._M_current = local_120;
                (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
            }
            piVar16 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar16[local_124] = piVar16[local_124] + -1;
            lVar20 = lVar20 + 1;
            lVar18 = lVar18 + 8;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
        }
        lVar18 = local_68;
        pvVar14 = local_d0;
        bVar15 = false;
      } while (bVar13);
      iVar27 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_68];
      local_120 = (double)CONCAT44(local_120._4_4_,iVar27);
      piVar16[iVar27] = 0;
      (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)local_d0] = iVar27;
      local_124 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar5._M_current =
           (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_78,iVar5,&local_124);
      }
      else {
        *iVar5._M_current = local_124;
        (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      uVar30 = local_f8;
      iVar5._M_current =
           (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_80,iVar5,(int *)&local_120);
      }
      else {
        *iVar5._M_current = (int)local_120;
        (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      pdVar22 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18;
      iVar6._M_current =
           (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_88,iVar6,pdVar22);
      }
      else {
        *iVar6._M_current = *pdVar22;
        (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_124 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar5._M_current =
           (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_90,iVar5,&local_124);
      }
      else {
        *iVar5._M_current = local_124;
        (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_98,iVar5,(int *)&local_120);
      }
      else {
        *iVar5._M_current = (int)local_120;
        (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_a0,iVar5,this->basic_index + (long)pvVar14);
      }
      else {
        *iVar5._M_current = this->basic_index[(long)pvVar14];
        (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar23._M_current =
           (this->refactor_info_).pivot_type.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar23._M_current ==
          (this->refactor_info_).pivot_type.
          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        __args = "\x02\x03\x04buildRankDeficiency0:";
        goto LAB_0036b188;
      }
      *iVar23._M_current = '\x02';
      goto LAB_0036b170;
    }
    goto LAB_0036aca7;
  }
  goto LAB_0036b1c9;
code_r0x0036aad6:
  if (1 < iVar24) {
    uVar25 = uVar26;
  }
  iVar17 = iVar17 + (uint)(1 < iVar24);
  lVar20 = lVar20 + 0x100000000;
  uVar26 = uVar26 + 1;
  piVar21 = piVar21 + 1;
  if (uVar19 == uVar26) goto code_r0x0036aaf6;
  goto LAB_0036aac5;
code_r0x0036aaf6:
  if (iVar17 == 1) {
    if ((int)uVar28 < (int)uVar25) {
      lVar31 = lVar31 << 3;
      iVar27 = uVar25 - uVar28;
      do {
        piVar21 = (int *)((long)(this->b_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar18);
        iVar5._M_current =
             (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_100,iVar5,piVar21);
        }
        else {
          *iVar5._M_current = *piVar21;
          (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        pdVar22 = (double *)
                  ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar31);
        iVar6._M_current =
             (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)local_108,iVar6,pdVar22);
        }
        else {
          *iVar6._M_current = *pdVar22;
          (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        lVar18 = lVar18 + 4;
        lVar31 = lVar31 + 8;
        iVar27 = iVar27 + -1;
      } while (iVar27 != 0);
    }
    iVar27 = uVar25 + 1;
    if (iVar27 < (int)(uint)local_110) {
      lVar18 = (long)iVar27 * 4;
      lVar20 = (long)iVar27 << 3;
      iVar27 = ~uVar25 + (uint)local_110;
      do {
        piVar21 = (int *)((long)(this->b_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar18);
        iVar5._M_current =
             (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_100,iVar5,piVar21);
        }
        else {
          *iVar5._M_current = *piVar21;
          (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        pdVar22 = (double *)
                  ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start + lVar20);
        iVar6._M_current =
             (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)local_108,iVar6,pdVar22);
        }
        else {
          *iVar6._M_current = *pdVar22;
          (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        lVar18 = lVar18 + 4;
        lVar20 = lVar20 + 8;
        iVar27 = iVar27 + -1;
      } while (iVar27 != 0);
    }
    pvVar14 = local_d0;
    iVar27 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(int)uVar25];
    local_120 = (double)CONCAT44(local_120._4_4_,iVar27);
    (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[iVar27] = 0;
    (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[(long)local_d0] = iVar27;
    local_124 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    iVar5._M_current =
         (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_78,iVar5,&local_124);
    }
    else {
      *iVar5._M_current = local_124;
      (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current + 1;
    }
    uVar30 = local_f8;
    iVar5._M_current =
         (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (local_80,iVar5,(int *)&local_120);
    }
    else {
      *iVar5._M_current = (int)local_120;
      (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    pdVar22 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + (int)uVar25;
    iVar6._M_current =
         (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                (local_88,iVar6,pdVar22);
    }
    else {
      *iVar6._M_current = *pdVar22;
      (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_124 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
    iVar5._M_current =
         (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_90,iVar5,&local_124);
    }
    else {
      *iVar5._M_current = local_124;
      (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current + 1;
    }
    iVar5._M_current =
         (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (local_98,iVar5,(int *)&local_120);
    }
    else {
      *iVar5._M_current = (int)local_120;
      (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    iVar5._M_current =
         (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (local_a0,iVar5,this->basic_index + (long)pvVar14);
    }
    else {
      *iVar5._M_current = this->basic_index[(long)pvVar14];
      (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    }
    iVar23._M_current =
         (this->refactor_info_).pivot_type.
         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar23._M_current ==
        (this->refactor_info_).pivot_type.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = "\x03\x04buildRankDeficiency0:";
LAB_0036b188:
      std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
                (local_a8,iVar23,__args);
    }
    else {
      *iVar23._M_current = '\x03';
LAB_0036b170:
      ppcVar1 = &(this->refactor_info_).pivot_type.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  else {
LAB_0036aca7:
    iVar17 = this->nwork;
    this->nwork = iVar17 + 1;
    piVar7[iVar17] = iVar27;
  }
  local_f0 = local_f0 + (double)(int)local_c0;
  uVar30 = uVar30 + 1;
  if (uVar30 == local_60) goto code_r0x0036b1b7;
  goto LAB_0036aa59;
code_r0x0036b1b7:
  uVar28 = this->nwork;
  uVar19 = local_ac;
  if (local_ac == uVar28) {
LAB_0036b1c9:
    lVar18 = (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    lVar20 = lVar18 >> 2;
    auVar34._8_4_ = (int)(lVar18 >> 0x22);
    auVar34._0_8_ = lVar20;
    auVar34._12_4_ = 0x45300000;
    lVar18 = (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    lVar31 = lVar18 >> 2;
    auVar35._8_4_ = (int)(lVar18 >> 0x22);
    auVar35._0_8_ = lVar31;
    auVar35._12_4_ = 0x45300000;
    this->build_synthetic_tick =
         local_f0 * 20.0 +
         ((local_70 - (double)(int)uVar19) +
          (((auVar34._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) - local_48) +
         (((auVar35._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar31) - 4503599627370496.0)) - local_58)) * 80.0 +
         this->build_synthetic_tick;
    local_120._0_4_ = -1;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->row_link_first,(long)this->num_basic + 1,(value_type_conflict2 *)&local_120);
    sVar29 = 0;
    local_120._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->mr_count,(long)this->num_row,(value_type_conflict2 *)&local_120);
    this->kernel_num_el = 0;
    iVar27 = this->num_row;
    if (0 < iVar27) {
      piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar16 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 = (this->mr_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar11 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = 0;
      sVar29 = 0;
      do {
        iVar17 = piVar7[lVar18];
        lVar20 = (long)iVar17;
        if (0 < lVar20) {
          piVar16[lVar18] = (int)sVar29;
          piVar8[lVar18] = iVar17 * 2;
          iVar27 = piVar9[lVar20];
          piVar10[lVar18] = -2 - iVar17;
          piVar11[lVar18] = iVar27;
          piVar9[lVar20] = (int)lVar18;
          if (-1 < (long)iVar27) {
            piVar10[iVar27] = (int)lVar18;
          }
          sVar29 = (size_type)(uint)((int)sVar29 + iVar17 * 2);
          iVar27 = this->num_row;
          this->kernel_num_el = iVar17 + this->kernel_num_el + 1;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar27);
    }
    std::vector<int,_std::allocator<int>_>::resize(&this->mr_index,sVar29);
    local_120._0_4_ = -1;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->col_link_first,(long)this->num_row + 1,(value_type_conflict2 *)&local_120);
    piVar7 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar7) {
      (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = piVar7;
    }
    iVar27 = this->num_basic;
    pdVar12 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar12) {
      (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar12;
    }
    iVar17 = 0;
    local_120._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->mc_count_a,(long)iVar27,(value_type_conflict2 *)&local_120);
    local_120 = (double)((ulong)local_120._4_4_ << 0x20);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->mc_count_n,(long)iVar27,(value_type_conflict2 *)&local_120);
    iVar27 = this->nwork;
    local_f8 = sVar29;
    if (0 < iVar27) {
      local_c0 = &this->mc_index;
      local_d0 = &this->mc_value;
      local_b8 = 0;
      local_c8 = 0;
      do {
        iVar27 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_b8];
        local_f0 = (double)CONCAT44(local_f0._4_4_,iVar27);
        lVar20 = (long)iVar27;
        (this->mc_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar20] =
             (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar20];
        (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar20] = (int)local_c8;
        piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = piVar7[lVar20 + 1] - piVar7[lVar20];
        (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar20] = iVar17 * 2;
        uVar28 = (int)local_c8 + iVar17 * 2;
        local_c8 = (ulong)uVar28;
        std::vector<int,_std::allocator<int>_>::resize(local_c0,(long)(int)uVar28);
        std::vector<double,_std::allocator<double>_>::resize(local_d0,(long)(int)uVar28);
        piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar18 = (long)piVar7[lVar20];
        if (piVar7[lVar20] < piVar7[lVar20 + 1]) {
          local_d8 = (vector<int,_std::allocator<int>_> *)
                     (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_e0 = (vector<int,std::allocator<int>> *)
                     (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar16 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar8 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_108 = (vector<int,std::allocator<int>> *)
                      (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_110 = (vector<int,std::allocator<int>> *)
                      (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          piVar9 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar12 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar10 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_e8 = (vector<double,_std::allocator<double>_> *)
                     (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar11 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          local_100 = (vector<int,std::allocator<int>> *)
                      (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          do {
            iVar17 = *(int *)((long)&(local_d8->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data._M_start + lVar18 * 4);
            dVar2 = *(double *)(local_e0 + lVar18 * 8);
            lVar31 = (long)iVar17;
            iVar24 = piVar8[lVar20];
            if (piVar16[lVar31] < 1) {
              iVar3 = *(int *)((vector<double,std::allocator<double>> *)local_108 + lVar20 * 4);
              uVar28 = *(uint *)(local_110 + lVar20 * 4);
              *(uint *)(local_110 + lVar20 * 4) = uVar28 + 1;
              iVar24 = ~uVar28 + iVar24 + iVar3;
              piVar9[iVar24] = iVar17;
              pdVar12[iVar24] = dVar2;
            }
            else {
              iVar3 = piVar10[lVar20];
              piVar10[lVar20] = iVar3 + 1;
              iVar24 = iVar24 + iVar3;
              piVar9[iVar24] = iVar17;
              pdVar12[iVar24] = dVar2;
              iVar17 = *(int *)((long)&(local_e8->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar31 * 4);
              iVar24 = piVar11[lVar31];
              piVar11[lVar31] = iVar24 + 1;
              *(int *)(local_100 + ((long)iVar17 + (long)iVar24) * 4) = iVar27;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < piVar7[lVar20 + 1]);
        }
        colFixMax(this,iVar27);
        piVar7 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar20];
        iVar24 = piVar7[iVar17];
        piVar16 = (this->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar16[lVar20] = -2 - iVar17;
        (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar20] = iVar24;
        piVar7[iVar17] = iVar27;
        if (-1 < (long)iVar24) {
          piVar16[iVar24] = local_f0._0_4_;
        }
        local_b8 = local_b8 + 1;
        iVar27 = this->nwork;
        iVar17 = (int)local_c8;
      } while (local_b8 < iVar27);
    }
    this->build_synthetic_tick =
         (double)((int)local_f8 * 0x14 + (iVar17 + iVar27 + this->num_row) * 0x28) +
         this->build_synthetic_tick;
    this->kernel_dim = iVar27;
    return;
  }
  goto LAB_0036aa34;
}

Assistant:

void HFactor::buildSimple() {
  /**
   * 0. Clear L and U factor
   */
  luClear();

  const bool progress_report = false;
  const HighsInt progress_frequency = 100000;

  // Set all values of permute to -1 so that unpermuted (rank
  // deficient) columns can be identified
  const HighsInt permute_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  permute.resize(permute_dim);
  permute.assign(permute_dim, -1);

  /**
   * 1. Prepare basis matrix and deal with unit columns
   */
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  HighsInt BcountX = 0;
  fill_n(mr_count_before.data(), num_row, 0);
  nwork = 0;
  if (report_anything) printf("\nFactor\n");
  // Compile a vector iwork of the indices within basic_index of the
  // its nwork non-unit structural columns: they will be formed into
  // the B matrix as the kernel
  const HighsInt iwork_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  iwork.resize(iwork_dim + 1, 0);
  iwork.assign(iwork_dim + 1, 0);
  for (HighsInt iCol = 0; iCol < num_basic; iCol++) {
    if (progress_report && iCol) {
      if (iCol % progress_frequency == 0)
        printf("HFactor::buildSimple stage = %6d\n", (int)iCol);
    }

    HighsInt iMat = basic_index[iCol];
    HighsInt iRow = -1;
    int8_t pivot_type = kPivotIllegal;
    // Look for unit columns as pivots. If there is already a pivot
    // corresponding to the nonzero in a unit column - evidenced by
    // mr_count_before[iRow] being negative - then, obviously, it
    // can't be used. However, it doesn't imply an error, or even rank
    // deficiency now that build() is being used to determine
    // rank. Treat it as a column to be handled in the kernel, so that
    // any rank deficiency or singularity is detected as late as
    // possible.
    if (iMat >= num_col) {
      // 1.1 Logical column
      //
      // Check for double pivot
      HighsInt lc_iRow = iMat - num_col;
      if (mr_count_before[lc_iRow] >= 0) {
        if (report_unit)
          printf("Stage %d: Logical\n", (int)(l_start.size() - 1));
        pivot_type = kPivotLogical;
        iRow = lc_iRow;
      } else {
        mr_count_before[lc_iRow]++;
        b_index[BcountX] = lc_iRow;
        b_value[BcountX++] = 1.0;
        iwork[nwork++] = iCol;
      }
    } else {
      // 1.2 Structural column
      HighsInt start = a_start[iMat];
      HighsInt count = a_start[iMat + 1] - start;
      // If this column and all subsequent columns are zero (so count
      // is 0) then a_index[start] and a_value[start] are unassigned,
      // so determine a unit column in two stages
      bool ok_unit_col = false;
      if (count == 1) {
        // Column has only one nonzero, but have to make sure that the
        // value is 1 and that there's not already a pivot
        // corresponding to this unit column
        ok_unit_col =
            a_value[start] == 1 && mr_count_before[a_index[start]] >= 0;
      }
      if (ok_unit_col) {
        if (report_unit) printf("Stage %d: Unit\n", (int)(l_start.size() - 1));
        // Don't exploit this special case in case the matrix is
        // re-factorized after scaling has been applied, making this
        // column non-unit.
        pivot_type = kPivotColSingleton;  //;kPivotUnit;//
        iRow = a_index[start];
      } else {
        for (HighsInt k = start; k < start + count; k++) {
          mr_count_before[a_index[k]]++;
          assert(BcountX < (HighsInt)b_index.size());
          b_index[BcountX] = a_index[k];
          b_value[BcountX++] = a_value[k];
        }
        iwork[nwork++] = iCol;
      }
    }

    if (iRow >= 0) {
      // 1.3 Record unit column
      permute[iCol] = iRow;
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
      // Was -num_row, but this is incorrect since the negation needs
      // to be great enough so that, starting from it, the accumulated
      // count can never reach zero
      mr_count_before[iRow] = -num_basic;
      assert(pivot_type != kPivotIllegal);
      this->refactor_info_.pivot_row.push_back(iRow);
      this->refactor_info_.pivot_var.push_back(iMat);
      this->refactor_info_.pivot_type.push_back(pivot_type);
    }
    b_start[iCol + 1] = BcountX;
    b_var[iCol] = iMat;
  }
  // Record the number of elements in the basis matrix
  basis_matrix_num_el = num_row - nwork + BcountX;

  // count1 = 0;
  // Comments: for pds-20, dfl001: 60 / 80
  // Comments: when system is large: enlarge
  // Comments: when system is small: decrease
  build_synthetic_tick += BcountX * 60 + (num_row - nwork) * 80;

  /**
   * 2. Search for and deal with singletons
   */
  double t2_search = 0;
  double t2_store_l = l_index.size();
  double t2_store_u = u_index.size();
  double t2_store_p = nwork;
  while (nwork > 0) {
    HighsInt nworkLast = nwork;
    nwork = 0;
    for (HighsInt i = 0; i < nworkLast; i++) {
      const HighsInt iCol = iwork[i];
      const HighsInt start = b_start[iCol];
      const HighsInt end = b_start[iCol + 1];
      HighsInt pivot_k = -1;
      HighsInt found_row_singleton = 0;
      HighsInt count = 0;

      // 2.1 Search for singleton
      t2_search += end - start;
      for (HighsInt k = start; k < end; k++) {
        const HighsInt iRow = b_index[k];
        if (mr_count_before[iRow] == 1) {
          pivot_k = k;
          found_row_singleton = 1;
          break;
        }
        if (mr_count_before[iRow] > 1) {
          pivot_k = k;
          count++;
        }
      }

      if (found_row_singleton) {
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / b_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n",
                 (int)(l_start.size() - 1), (int)pivot_k, pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt iRow = b_index[k];
            if (mr_count_before[iRow] > 0) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k] * pivot_multiplier);
              l_index.push_back(iRow);
              l_value.push_back(b_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k]);
              u_index.push_back(iRow);
              u_value.push_back(b_value[k]);
            }
            mr_count_before[iRow]--;
          }
        }
        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);

        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotRowSingleton);
      } else if (count == 1) {
        if (report_singletons)
          printf("Stage %d: Col singleton \n", (int)(l_start.size() - 1));
        // 2.3 Deal with column singleton
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }

        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);
        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotColSingleton);
      } else {
        iwork[nwork++] = iCol;
      }
    }

    // No singleton found in the last pass
    if (nworkLast == nwork) break;
  }
  if (report_anything) reportLu(kReportLuBoth, false);
  t2_store_l = static_cast<double>(l_index.size()) - t2_store_l;
  t2_store_u = static_cast<double>(u_index.size()) - t2_store_u;
  t2_store_p = t2_store_p - nwork;

  build_synthetic_tick +=
      t2_search * 20 + (t2_store_p + t2_store_l + t2_store_u) * 80;

  /**
   * 3. Prepare the kernel parts
   */
  // 3.1 Prepare row links, row matrix spaces
  row_link_first.assign(num_basic + 1, -1);
  mr_count.assign(num_row, 0);
  HighsInt mr_countX = 0;
  // Determine the number of entries in the kernel
  kernel_num_el = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt count = mr_count_before[iRow];
    if (count > 0) {
      mr_start[iRow] = mr_countX;
      mr_space[iRow] = count * 2;
      mr_countX += count * 2;
      rlinkAdd(iRow, count);
      kernel_num_el += count + 1;
    }
  }
  mr_index.resize(mr_countX);

  // 3.2 Prepare column links, kernel matrix
  col_link_first.assign(num_row + 1, -1);
  const HighsInt mc_dim = num_basic;
  mc_index.clear();
  mc_value.clear();
  mc_count_a.assign(mc_dim, 0);
  mc_count_n.assign(mc_dim, 0);
  HighsInt MCcountX = 0;
  for (HighsInt i = 0; i < nwork; i++) {
    HighsInt iCol = iwork[i];
    mc_var[iCol] = b_var[iCol];
    mc_start[iCol] = MCcountX;
    mc_space[iCol] = (b_start[iCol + 1] - b_start[iCol]) * 2;
    MCcountX += mc_space[iCol];
    mc_index.resize(MCcountX);
    mc_value.resize(MCcountX);
    for (HighsInt k = b_start[iCol]; k < b_start[iCol + 1]; k++) {
      const HighsInt iRow = b_index[k];
      const double value = b_value[k];
      if (mr_count_before[iRow] > 0) {
        colInsert(iCol, iRow, value);
        rowInsert(iCol, iRow);
      } else {
        colStoreN(iCol, iRow, value);
      }
    }
    colFixMax(iCol);
    clinkAdd(iCol, mc_count_a[iCol]);
  }
  build_synthetic_tick += (num_row + nwork + MCcountX) * 40 + mr_countX * 20;
  // Record the kernel dimension
  kernel_dim = nwork;
  assert((HighsInt)this->refactor_info_.pivot_row.size() == num_basic - nwork);
}